

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

hash_code llvm::hashing::detail::
          hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           last)

{
  uchar *puVar1;
  uint64_t seed;
  hash_code hVar2;
  size_t sVar3;
  ulong uVar4;
  uchar *puVar5;
  char buffer [64];
  hash_state state;
  
  seed = get_execution_seed();
  for (sVar3 = 0; (puVar5 = first._M_current + sVar3, puVar5 != last._M_current && (sVar3 < 0x40));
      sVar3 = sVar3 + 1) {
    buffer[sVar3] = *puVar5;
  }
  if (puVar5 == last._M_current) {
    hVar2.value = hash_short(buffer,sVar3,seed);
  }
  else {
    if (sVar3 != 0x40) {
      __assert_fail("buffer_ptr == buffer_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Hashing.h"
                    ,0x1a0,
                    "hash_code llvm::hashing::detail::hash_combine_range_impl(InputIteratorT, InputIteratorT) [InputIteratorT = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>]"
                   );
    }
    hash_state::create(&state,buffer,seed);
    sVar3 = 0x40;
    while (puVar5 != last._M_current) {
      for (uVar4 = 0; (puVar1 = puVar5 + uVar4, puVar1 != last._M_current && (uVar4 < 0x40));
          uVar4 = uVar4 + 1) {
        buffer[uVar4] = *puVar1;
      }
      std::_V2::__rotate<char*>(buffer,buffer + uVar4,&state);
      hash_state::mix(&state,buffer);
      sVar3 = sVar3 + uVar4;
      puVar5 = puVar1;
    }
    hVar2.value = hash_state::finalize(&state,sVar3);
  }
  return (hash_code)hVar2.value;
}

Assistant:

hash_code hash_combine_range_impl(InputIteratorT first, InputIteratorT last) {
  const uint64_t seed = get_execution_seed();
  char buffer[64], *buffer_ptr = buffer;
  char *const buffer_end = std::end(buffer);
  while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                            get_hashable_data(*first)))
    ++first;
  if (first == last)
    return hash_short(buffer, buffer_ptr - buffer, seed);
  assert(buffer_ptr == buffer_end);

  hash_state state = state.create(buffer, seed);
  size_t length = 64;
  while (first != last) {
    // Fill up the buffer. We don't clear it, which re-mixes the last round
    // when only a partial 64-byte chunk is left.
    buffer_ptr = buffer;
    while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                              get_hashable_data(*first)))
      ++first;

    // Rotate the buffer if we did a partial fill in order to simulate doing
    // a mix of the last 64-bytes. That is how the algorithm works when we
    // have a contiguous byte sequence, and we want to emulate that here.
    std::rotate(buffer, buffer_ptr, buffer_end);

    // Mix this chunk into the current state.
    state.mix(buffer);
    length += buffer_ptr - buffer;
  };

  return state.finalize(length);
}